

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::GeneratorContext::GetCompilerVersion
          (GeneratorContext *this,Version *version)

{
  Arena *arena;
  string_view value;
  
  *(undefined8 *)((long)&version->field_0 + 0x10) = 0x1f00000006;
  (version->field_0)._impl_.patch_ = 0;
  *(byte *)&version->field_0 = *(byte *)&version->field_0 | 0xf;
  arena = (Arena *)(version->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  value._M_str = "-dev";
  value._M_len = 4;
  internal::ArenaStringPtr::Set(&(version->field_0)._impl_.suffix_,value,arena);
  return;
}

Assistant:

void GeneratorContext::GetCompilerVersion(Version* version) const {
  version->set_major(GOOGLE_PROTOBUF_VERSION / 1000000);
  version->set_minor(GOOGLE_PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(GOOGLE_PROTOBUF_VERSION % 1000);
  version->set_suffix(GOOGLE_PROTOBUF_VERSION_SUFFIX);
}